

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifReduce.c
# Opt level: O3

int If_ManImproveNodeFaninCost(If_Man_t *p,If_Obj_t *pObj)

{
  uint uVar1;
  
  if (((undefined1  [112])*pObj & (undefined1  [112])0xf) == (undefined1  [112])0x4) {
    uVar1 = -(uint)(pObj->nRefs == 0);
    if (((pObj->pFanin0->field_0x1 & 1) == 0) && (pObj->pFanin0->nRefs == 0)) {
      uVar1 = (uint)(pObj->nRefs != 0);
    }
    if ((pObj->pFanin1->field_0x1 & 1) == 0) {
      uVar1 = uVar1 + (pObj->pFanin1->nRefs == 0);
    }
    return uVar1;
  }
  __assert_fail("If_ObjIsAnd(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifReduce.c"
                ,0x121,"int If_ManImproveNodeFaninCost(If_Man_t *, If_Obj_t *)");
}

Assistant:

int If_ManImproveNodeFaninCost( If_Man_t * p, If_Obj_t * pObj )
{
    int Counter = 0;
    assert( If_ObjIsAnd(pObj) );
    // check if the node has external refs
    if ( pObj->nRefs == 0 )
        Counter--;
    // increment the number of fanins without external refs
    if ( !If_ObjFanin0(pObj)->fMark && If_ObjFanin0(pObj)->nRefs == 0 )
        Counter++;
    // increment the number of fanins without external refs
    if ( !If_ObjFanin1(pObj)->fMark && If_ObjFanin1(pObj)->nRefs == 0 )
        Counter++;
    return Counter;
}